

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O3

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::TriangleLight>::transform
          (LightNodeImpl<embree::SceneGraph::TriangleLight> *this,AffineSpace3fa *space)

{
  _func_int **pp_Var1;
  AffineSpace3fa *in_RDX;
  undefined4 local_78;
  _func_int *local_68;
  _func_int *p_Stack_60;
  _func_int *local_58;
  _func_int *p_Stack_50;
  _func_int *local_48;
  _func_int *p_Stack_40;
  _func_int *local_38;
  _func_int *p_Stack_30;
  
  pp_Var1 = (_func_int **)alignedMalloc(0xc0,0x10);
  TriangleLight::transform((TriangleLight *)&space[1].p,in_RDX);
  pp_Var1[1] = (_func_int *)0x0;
  pp_Var1[2] = (_func_int *)(pp_Var1 + 4);
  pp_Var1[3] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var1 + 4) = 0;
  pp_Var1[6] = (_func_int *)(pp_Var1 + 8);
  pp_Var1[7] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var1 + 8) = 0;
  pp_Var1[10] = (_func_int *)0x0;
  *(undefined2 *)(pp_Var1 + 0xb) = 0;
  *(undefined4 *)((long)pp_Var1 + 0x5c) = 0xffffffff;
  pp_Var1[0xc] = (_func_int *)0x0;
  *pp_Var1 = (_func_int *)&PTR__Node_002c6fe8;
  *(undefined4 *)(pp_Var1 + 0xe) = local_78;
  pp_Var1[0x10] = local_68;
  pp_Var1[0x11] = p_Stack_60;
  pp_Var1[0x12] = local_58;
  pp_Var1[0x13] = p_Stack_50;
  pp_Var1[0x14] = local_48;
  pp_Var1[0x15] = p_Stack_40;
  pp_Var1[0x16] = local_38;
  pp_Var1[0x17] = p_Stack_30;
  (this->super_LightNode).super_Node.super_RefCount._vptr_RefCount = pp_Var1;
  LOCK();
  pp_Var1[1] = pp_Var1[1] + 1;
  UNLOCK();
  return (Ref<embree::SceneGraph::LightNode>)&this->super_LightNode;
}

Assistant:

virtual Ref<LightNode> transform(const AffineSpace3fa& space) const {
        return new LightNodeImpl(light.transform(space));
      }